

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::LowerCoerseStrOrRegex(Lowerer *this,Instr *instr)

{
  bool bVar1;
  Opnd *pOVar2;
  RegOpnd *baseOpnd;
  LabelInstr *labelTarget;
  LabelInstr *target;
  IndirOpnd *compareSrc1;
  Opnd *vtableOpnd;
  LabelInstr *doneLabel;
  LabelInstr *helperLabel;
  RegOpnd *src1Opnd;
  Instr *instr_local;
  Lowerer *this_local;
  
  pOVar2 = IR::Instr::GetSrc1(instr);
  baseOpnd = IR::Opnd::AsRegOpnd(pOVar2);
  labelTarget = IR::LabelInstr::New(Label,this->m_func,true);
  target = IR::LabelInstr::New(Label,this->m_func,false);
  bVar1 = IR::Opnd::IsNotTaggedValue(&baseOpnd->super_Opnd);
  if (!bVar1) {
    LowererMD::GenerateObjectTest(&this->m_lowererMD,&baseOpnd->super_Opnd,instr,labelTarget,false);
  }
  pOVar2 = LoadVTableValueOpnd(this,instr,VtableJavascriptRegExp);
  compareSrc1 = IR::IndirOpnd::New(baseOpnd,0,TyUint64,instr->m_func,false);
  InsertCompareBranch(this,&compareSrc1->super_Opnd,pOVar2,BrNeq_A,labelTarget,instr,false);
  pOVar2 = IR::Instr::GetDst(instr);
  InsertMove(pOVar2,&baseOpnd->super_Opnd,instr,true);
  InsertBranch(Br,target,instr);
  IR::Instr::InsertBefore(instr,&labelTarget->super_Instr);
  IR::Instr::InsertAfter(instr,&target->super_Instr);
  LowerConvStr(this,instr);
  return;
}

Assistant:

void
Lowerer::LowerCoerseStrOrRegex(IR::Instr* instr)
{
    IR::RegOpnd * src1Opnd = instr->GetSrc1()->AsRegOpnd();

    IR::LabelInstr * helperLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
    IR::LabelInstr * doneLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);

    // if (value == regex) goto :done
    if (!src1Opnd->IsNotTaggedValue())
    {
        this->m_lowererMD.GenerateObjectTest(src1Opnd, instr, helperLabel);
    }

    IR::Opnd * vtableOpnd = LoadVTableValueOpnd(instr, VTableValue::VtableJavascriptRegExp);

    InsertCompareBranch(IR::IndirOpnd::New(src1Opnd, 0, TyMachPtr, instr->m_func),
        vtableOpnd, Js::OpCode::BrNeq_A, helperLabel, instr);

    InsertMove(instr->GetDst(), src1Opnd, instr);
    InsertBranch(Js::OpCode::Br, doneLabel, instr);
    instr->InsertBefore(helperLabel);

    instr->InsertAfter(doneLabel);

    // helper: ConvStr value
    LowerConvStr(instr);
}